

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.cpp
# Opt level: O0

Ref<embree::Image> embree::loadSTB(FileName *fileName)

{
  stbi_uc *psVar1;
  runtime_error *this;
  _func_int **pp_Var2;
  Image *in_RDI;
  float a;
  float b;
  float g;
  float r;
  size_t x;
  size_t y;
  float rcpMaxColor;
  Image *out;
  uchar *pixels;
  int channels;
  int height;
  int width;
  FileName *in_stack_fffffffffffffe48;
  float local_1ac;
  float local_1a8;
  int in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  Image *__rhs;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  ulong local_130;
  ulong local_128;
  undefined4 local_120;
  undefined1 local_119;
  string local_118 [32];
  _func_int **local_f8;
  undefined1 local_e9;
  string local_c8 [48];
  undefined1 local_98 [44];
  int local_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_68;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float *local_40;
  _func_int **local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  this_00 = (ImageT<embree::Col4<unsigned_char>_> *)local_98;
  __rhs = in_RDI;
  FileName::str_abi_cxx11_(in_stack_fffffffffffffe48);
  std::__cxx11::string::c_str();
  psVar1 = stbi_load(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                     (int *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe5c);
  std::__cxx11::string::~string((string *)local_98);
  local_98._32_8_ = psVar1;
  if (psVar1 != (stbi_uc *)0x0) {
    pp_Var2 = (_func_int **)::operator_new(0x48);
    local_119 = 1;
    FileName::operator_cast_to_string(in_stack_fffffffffffffe48);
    ImageT<embree::Col4<unsigned_char>_>::ImageT
              (this_00,(size_t)__rhs,(size_t)in_RDI,in_stack_fffffffffffffe80);
    local_119 = 0;
    std::__cxx11::string::~string(local_118);
    local_120 = 0x3b808081;
    local_f8 = pp_Var2;
    for (local_128 = 0; local_128 < (ulong)(long)(int)local_68._M_allocated_capacity._0_4_;
        local_128 = local_128 + 1) {
      for (local_130 = 0; local_130 < (ulong)(long)(int)local_68._M_allocated_capacity._4_4_;
          local_130 = local_130 + 1) {
        if (local_6c < 1) {
          local_134 = 0.0;
        }
        else {
          local_134 = (float)*(byte *)(local_98._32_8_ +
                                      (local_128 * (long)(int)local_68._M_allocated_capacity._4_4_ +
                                      local_130) * (long)local_6c) * 0.003921569;
        }
        local_138 = local_134;
        if (1 < local_6c) {
          local_138 = (float)*(byte *)(local_98._32_8_ +
                                      (local_128 * (long)(int)local_68._M_allocated_capacity._4_4_ +
                                      local_130) * (long)local_6c + 1) * 0.003921569;
        }
        if (local_6c < 3) {
          local_13c = local_134;
          if (local_6c != 1) {
            local_1a8 = 0.0;
            local_13c = local_1a8;
          }
        }
        else {
          local_13c = (float)*(byte *)(local_98._32_8_ +
                                      (local_128 * (long)(int)local_68._M_allocated_capacity._4_4_ +
                                      local_130) * (long)local_6c + 2) * 0.003921569;
        }
        if (local_6c < 4) {
          local_1ac = 1.0;
        }
        else {
          local_1ac = (float)*(byte *)(local_98._32_8_ +
                                      (local_128 * (long)(int)local_68._M_allocated_capacity._4_4_ +
                                      local_130) * (long)local_6c + 3) * 0.003921569;
        }
        local_140 = local_1ac;
        local_40 = &local_158;
        local_50 = local_1ac;
        local_4 = local_1ac;
        local_28 = CONCAT44(local_138,local_134);
        uStack_20 = CONCAT44(local_1ac,local_13c);
        fStack_14c = local_1ac;
        local_4c = local_13c;
        local_48 = local_138;
        local_44 = local_134;
        local_10 = local_134;
        local_c = local_138;
        local_8 = local_13c;
        local_158 = local_134;
        fStack_154 = local_138;
        fStack_150 = local_13c;
        (**(code **)(*local_f8 + 0x28))(local_f8,local_130,local_128,&local_158);
      }
    }
    stbi_image_free((void *)0x42b2da);
    local_38 = local_f8;
    (in_RDI->super_RefCount)._vptr_RefCount = local_f8;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    return (Ref<embree::Image>)__rhs;
  }
  local_e9 = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  FileName::str_abi_cxx11_(in_stack_fffffffffffffe48);
  std::operator+((char *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::runtime_error::runtime_error(this,local_c8);
  local_e9 = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadSTB(const FileName& fileName)
  {
    int width, height, channels;
    unsigned char *pixels = stbi_load(fileName.str().c_str(), &width, &height, &channels, 0);
    if(pixels == nullptr) {
      THROW_RUNTIME_ERROR("Could not load " + fileName.str());
    }

    Image* out = new Image4uc(width, height, fileName);
    const float rcpMaxColor = 1.f/255.f;
    for (size_t y = 0; y < height; y++)
    {
      for (size_t x = 0; x < width; x++)
      {
        float r = (channels > 0) ? (float(pixels[(y*width+x)*channels+0]) * rcpMaxColor) : 0.f;
        float g = (channels > 1) ? (float(pixels[(y*width+x)*channels+1]) * rcpMaxColor) : r;
        float b = (channels > 2) ? (float(pixels[(y*width+x)*channels+2]) * rcpMaxColor) : ((channels == 1) ? r : 0.f);
        float a = (channels > 3) ? (float(pixels[(y*width+x)*channels+3]) * rcpMaxColor) : 1.f;
        out->set(x, y, Color4(r,g,b,a));
      }
    }

    stbi_image_free(pixels);

    return out;
  }